

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

bool __thiscall
mylanguage_driver::parse_stream(mylanguage_driver *this,istream *in,cstref sname,ostream *out)

{
  int iVar1;
  undefined1 local_370 [7];
  bool success;
  mylanguage_parser parser;
  undefined1 local_328 [8];
  mylanguage_lexer scanner;
  ostream *out_local;
  cstref sname_local;
  istream *in_local;
  mylanguage_driver *this_local;
  
  scanner.loc.end._8_8_ = out;
  std::__cxx11::string::operator=((string *)(this + 8),(string *)sname);
  mylanguage_lexer::mylanguage_lexer((mylanguage_lexer *)local_328,in,(ostream *)0x0);
  FlexLexer::set_debug((FlexLexer *)local_328,(byte)this[0x30] & 1);
  *(undefined1 **)(this + 0x28) = local_328;
  yy::mylanguage_parser::mylanguage_parser((mylanguage_parser *)local_370,this);
  yy::mylanguage_parser::set_debug_level((mylanguage_parser *)local_370,(byte)this[0x31] & 1);
  iVar1 = yy::mylanguage_parser::parse((mylanguage_parser *)local_370);
  *(undefined8 *)(this + 0x28) = 0;
  yy::mylanguage_parser::~mylanguage_parser((mylanguage_parser *)local_370);
  mylanguage_lexer::~mylanguage_lexer((mylanguage_lexer *)local_328);
  return iVar1 == 0;
}

Assistant:

bool mylanguage_driver::parse_stream(istream& in, cstref sname, ostream& out)
{
    //reset();
    streamname = sname;
    mylanguage_lexer scanner(&in);
    scanner.set_debug(trace_scanning);
    lexer = &scanner;
    yy::mylanguage_parser parser(*this);
    parser.set_debug_level(trace_parsing);
    bool success = parser.parse() == 0;
    lexer = nullptr; // it's only active on the stack
    return success;
}